

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall TrodesMsg::processArg(TrodesMsg *this,char c,uint64_t *a)

{
  char *__nptr;
  ulonglong uVar1;
  string *this_00;
  allocator local_11;
  
  if (c == '8') {
    __nptr = zmsg_popstr(this->msg);
    if (__nptr == (char *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = strtoull(__nptr,(char **)0x0,10);
    }
    *a = uVar1;
    free(__nptr);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,"Could not read message. Expected different type, got uint64_t",&local_11);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, uint64_t &a){
    if(c != '8') throw std::string(PROCESSERROR "uint64_t");
    char *str = zmsg_popstr(msg);
    a = str ? (uint64_t) strtoull(str, NULL, 10) : 0;
    freen(str);
}